

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

err_t bpkiShareUnwrap(octet *share,size_t *share_len,octet *epki,size_t epki_len,octet *pwd,
                     size_t pwd_len)

{
  bool_t bVar1;
  size_t sVar2;
  octet *salt_00;
  octet *salt_len;
  octet *pwd_00;
  size_t sVar3;
  size_t in_RCX;
  void *in_RDX;
  void *in_RSI;
  byte *in_RDI;
  void *in_R8;
  size_t in_R9;
  bool bVar4;
  size_t unaff_retaddr;
  octet *in_stack_00000008;
  err_t code;
  octet *edata;
  octet *key;
  octet *salt;
  void *state;
  size_t iter;
  size_t count;
  size_t pki_len;
  size_t edata_len;
  size_t in_stack_00000110;
  octet *in_stack_00000118;
  size_t *in_stack_00000120;
  octet *in_stack_00000128;
  size_t *in_stack_00000130;
  octet *in_stack_00000138;
  size_t in_stack_ffffffffffffff78;
  octet *header;
  size_t in_stack_ffffffffffffffa8;
  octet *in_stack_ffffffffffffffb8;
  size_t local_40;
  err_t local_4;
  
  if ((((in_RCX == 0xffffffffffffffff) || (bVar1 = memIsValid(in_RDX,in_RCX), bVar1 == 0)) ||
      (bVar1 = memIsValid(in_R8,in_R9), bVar1 == 0)) ||
     ((in_RSI != (void *)0x0 && (bVar1 = memIsValid(in_RSI,8), bVar1 == 0)))) {
    local_4 = 0x6d;
  }
  else {
    sVar2 = bpkiEdataDec(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                         in_stack_00000118,in_stack_00000110);
    if (sVar2 == in_RCX) {
      salt_00 = (octet *)blobCreate(in_stack_ffffffffffffff78);
      if (salt_00 == (octet *)0x0) {
        local_4 = 0x6e;
      }
      else {
        salt_len = salt_00 + 8;
        header = salt_00;
        pwd_00 = (octet *)bpkiEdataDec(in_stack_00000138,in_stack_00000130,in_stack_00000128,
                                       in_stack_00000120,in_stack_00000118,in_stack_00000110);
        local_4 = beltPBKDF2(in_stack_ffffffffffffffb8,pwd_00,in_stack_ffffffffffffffa8,
                             (size_t)header,salt_00,(size_t)salt_len);
        if (local_4 == 0) {
          local_4 = beltKWPUnwrap(in_stack_ffffffffffffffb8,pwd_00,in_stack_ffffffffffffffa8,header,
                                  salt_00,(size_t)salt_len);
          if (local_4 == 0) {
            sVar2 = local_40 - 0x10;
            sVar3 = bpkiShareDec(key,(size_t *)edata,in_stack_00000008,unaff_retaddr);
            local_4 = 0x132;
            if (sVar3 == sVar2) {
              local_4 = 0;
            }
            if (local_4 == 0) {
              bVar4 = true;
              if (in_RDI != (byte *)0x0) {
                bVar1 = memIsValid(in_RDI,local_40);
                bVar4 = bVar1 != 0;
              }
              local_4 = 0x6d;
              if (bVar4) {
                local_4 = 0;
              }
              if (local_4 == 0) {
                bpkiShareDec(key,(size_t *)edata,in_stack_00000008,unaff_retaddr);
                bVar4 = true;
                if ((in_RDI != (byte *)0x0) && (bVar4 = false, *in_RDI != 0)) {
                  bVar4 = *in_RDI < 0x11;
                }
                local_4 = 0x1fc;
                if (bVar4) {
                  local_4 = 0;
                }
                blobClose((blob_t)0x14e5ca);
              }
              else {
                blobClose((blob_t)0x14e53e);
              }
            }
            else {
              blobClose((blob_t)0x14e4e1);
            }
          }
          else {
            blobClose((blob_t)0x14e479);
          }
        }
        else {
          blobClose((blob_t)0x14e431);
        }
      }
    }
    else {
      local_4 = 0x132;
    }
  }
  return local_4;
}

Assistant:

err_t bpkiShareUnwrap(octet share[], size_t* share_len,
	const octet epki[], size_t epki_len, const octet pwd[], size_t pwd_len)
{
	size_t edata_len, pki_len, count, iter;
	void* state;
	octet* salt;
	octet* key;
	octet* edata;
	err_t code;
	// проверить входные данные
	if (epki_len == SIZE_MAX || !memIsValid(epki, epki_len) ||
		!memIsValid(pwd, pwd_len) ||
		share_len && !memIsValid(share_len, O_PER_S))
		return ERR_BAD_INPUT;
	// определить размер edata
	count = bpkiEdataDec(0, &edata_len, 0, 0, epki, epki_len);
	if (count != epki_len)
		return ERR_BAD_FORMAT;
	// подготовить буферы для параметров PBKDF2
	state = blobCreate(8 + 32 + edata_len);
	if (!state)
		return ERR_OUTOFMEMORY;
	salt = (octet*)state;
	key = salt + 8;
	edata = key + 32;
	// выделить edata
	count = bpkiEdataDec(edata, 0, salt, &iter, epki, epki_len);
	ASSERT(count == epki_len);
	// построить ключ защиты 
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(state));
	// снять защиту
	code = beltKWPUnwrap(edata, edata, edata_len, 0, key, 32);
	ERR_CALL_HANDLE(code, blobClose(state));
	pki_len = edata_len - 16;
	// определить длину share
	count = bpkiShareDec(share, &edata_len, edata, pki_len);
	code = count == pki_len ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// проверить указатель share 
	code = memIsNullOrValid(share, edata_len) ? ERR_OK : ERR_BAD_INPUT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// декодировать pki
	count = bpkiShareDec(share, share_len, edata, pki_len);
	ASSERT(count == pki_len);
	// проверить первый октет share
	code = !share || 1 <= share[0] && share[0] <= 16 ?
		ERR_OK : ERR_BAD_SHAREKEY;
	// завершить
	blobClose(state);
	return code;
}